

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cpp
# Opt level: O3

HT_TCPServer * ht_tcp_server_create(void)

{
  HT_TCPServer *pHVar1;
  HT_Mutex *pHVar2;
  
  pHVar1 = (HT_TCPServer *)ht_alloc(0x48);
  ht_bag_int_init(&pHVar1->client_sock_fd,8);
  pHVar1->accept_client_thread = (HT_Thread *)0x0;
  pHVar2 = ht_mutex_create();
  pHVar1->client_mutex = pHVar2;
  pHVar1->server_sock_fd = -1;
  pHVar1->client_connected_cb = (OnClientConnected)0x0;
  pHVar1->client_connected_ud = (void *)0x0;
  return pHVar1;
}

Assistant:

HT_TCPServer*
ht_tcp_server_create(void)
{
    HT_TCPServer* server = HT_CREATE_TYPE(HT_TCPServer);

    ht_bag_int_init(&server->client_sock_fd, 8);
    server->accept_client_thread = NULL;
    server->client_mutex = ht_mutex_create();
    server->server_sock_fd = -1;
    server->client_connected_cb = NULL;
    server->client_connected_ud = NULL;

    return server;
}